

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ukf.cpp
# Opt level: O3

void __thiscall
UKF::PredictRadarMeasurement
          (UKF *this,MatrixXd *Xsig_pred,MatrixXd *Zsig,VectorXd *z_pred,MatrixXd *S)

{
  double *pdVar1;
  ulong uVar2;
  double *pdVar3;
  double *pdVar4;
  undefined1 *puVar5;
  bool bVar6;
  double dVar7;
  double dVar8;
  long lVar9;
  CommaInitializer<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *pCVar10;
  char *pcVar11;
  Index IVar12;
  RhsNested pMVar13;
  long lVar14;
  Index index;
  ulong uVar15;
  ulong uVar16;
  ActualDstType actualDst;
  double dVar17;
  MatrixXd R;
  ActualDstType actualDst_1;
  DenseStorage<double,__1,__1,__1,_0> local_118;
  MatrixXd *local_100;
  double local_f8;
  undefined1 local_f0 [8];
  variable_if_dynamic<long,__1> local_e8;
  scalar_constant_op<double> local_e0;
  MatrixXd *local_d8;
  scalar_constant_op<double> local_d0;
  RhsNested local_c8;
  undefined1 *local_c0;
  RhsNested local_b8;
  double local_a8;
  Scalar local_a0;
  double local_98;
  undefined8 uStack_90;
  Index local_80;
  double local_78;
  double local_70;
  double local_68;
  Scalar local_60;
  Scalar local_58;
  Scalar local_50;
  double local_48;
  Scalar local_40;
  Scalar local_38;
  
  IVar12 = (z_pred->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows
  ;
  local_100 = S;
  local_80 = IVar12;
  if (this->n_sigma_ < 1) {
    bVar6 = false;
  }
  else {
    lVar14 = 0;
    do {
      uVar2 = (Xsig_pred->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
              m_storage.m_rows;
      if (((((long)uVar2 < 1) ||
           ((Xsig_pred->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
            m_cols <= lVar14)) || (uVar2 < 2)) || ((uVar2 == 2 || (uVar2 < 4)))) {
        __assert_fail("row >= 0 && row < rows() && col >= 0 && col < cols()",
                      "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x77,
                      "CoeffReturnType Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, -1>, 0>::operator()(Index, Index) const [Derived = Eigen::Matrix<double, -1, -1>, Level = 0]"
                     );
      }
      pdVar3 = (Xsig_pred->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
               m_storage.m_data;
      lVar9 = uVar2 * lVar14;
      local_98 = pdVar3[lVar9];
      local_a8 = pdVar3[lVar9 + 1];
      local_70 = pdVar3[lVar9 + 2];
      local_f8 = pdVar3[lVar9 + 3];
      local_78 = cos(local_f8);
      local_f8 = sin(local_f8);
      lVar9 = (Zsig->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
              m_rows;
      if ((lVar9 < 1) ||
         ((Zsig->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_cols
          <= lVar14)) {
LAB_00106f20:
        __assert_fail("row >= 0 && row < rows() && col >= 0 && col < cols()",
                      "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x16f,
                      "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, -1>, 1>::operator()(Index, Index) [Derived = Eigen::Matrix<double, -1, -1>, Level = 1]"
                     );
      }
      (Zsig->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_data
      [lVar9 * lVar14] = SQRT(local_98 * local_98 + local_a8 * local_a8);
      dVar17 = atan2(local_a8,local_98);
      uVar2 = (Zsig->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
              m_rows;
      if (((long)uVar2 < 2) ||
         ((Zsig->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_cols
          <= lVar14)) goto LAB_00106f20;
      pdVar3 = (Zsig->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
               m_data;
      lVar9 = uVar2 * lVar14;
      pdVar3[lVar9 + 1] = dVar17;
      dVar17 = pdVar3[lVar9];
      if ((dVar17 != 0.0) || (NAN(dVar17))) {
        if (uVar2 < 3) goto LAB_00106f20;
        dVar17 = (local_98 * local_78 * local_70 + local_a8 * local_f8 * local_70) / dVar17;
      }
      else {
        dVar17 = 0.0;
        if (uVar2 < 3) goto LAB_00106f20;
      }
      pdVar3[lVar9 + 2] = dVar17;
      lVar14 = lVar14 + 1;
    } while (lVar14 < this->n_sigma_);
    IVar12 = (z_pred->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
             m_rows;
    bVar6 = 0 < this->n_sigma_;
  }
  if (IVar12 < 0) {
    pcVar11 = 
    "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Matrix<double, -1, 1>]"
    ;
LAB_00106fdf:
    __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                  ,"/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h",0x4a,pcVar11);
  }
  if (IVar12 != 0) {
    memset((z_pred->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
           ,0,IVar12 << 3);
  }
  if (bVar6) {
    lVar14 = 0;
    lVar9 = 0;
    do {
      if ((this->weights_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
          m_rows <= lVar9) goto LAB_00106f01;
      pdVar3 = (Zsig->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
               m_data;
      uVar2 = (Zsig->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
              m_rows;
      if ((long)uVar2 < 0 && pdVar3 != (double *)0x0) goto LAB_00106f5e;
      if ((Zsig->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_cols
          <= lVar9) goto LAB_00106f3f;
      if ((long)uVar2 < 0) {
        pcVar11 = 
        "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = const Eigen::Matrix<double, -1, 1>]"
        ;
        goto LAB_00106fdf;
      }
      if ((z_pred->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows
          != uVar2) {
        pcVar11 = 
        "Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1>>, const Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_sum_op<double>, Lhs = const Eigen::Matrix<double, -1, 1>, Rhs = const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1>>, const Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>>]"
        ;
        goto LAB_00106fc0;
      }
      dVar17 = (this->weights_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
               m_storage.m_data[lVar9];
      pdVar4 = (z_pred->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
               m_data;
      uVar15 = uVar2 & 0x7ffffffffffffffe;
      if (1 < uVar2) {
        uVar16 = 0;
        do {
          dVar7 = (pdVar4 + uVar16)[1];
          pdVar1 = (double *)((long)pdVar3 + uVar16 * 8 + uVar2 * lVar14);
          dVar8 = pdVar1[1];
          pdVar4[uVar16] = *pdVar1 * dVar17 + pdVar4[uVar16];
          (pdVar4 + uVar16)[1] = dVar8 * dVar17 + dVar7;
          uVar16 = uVar16 + 2;
        } while (uVar16 < uVar15);
      }
      if ((long)uVar15 < (long)uVar2) {
        do {
          pdVar4[uVar15] =
               *(double *)((long)pdVar3 + uVar15 * 8 + uVar2 * lVar14) * dVar17 + pdVar4[uVar15];
          uVar15 = uVar15 + 1;
        } while (uVar2 != uVar15);
      }
      lVar9 = lVar9 + 1;
      lVar14 = lVar14 + 8;
    } while (lVar9 < this->n_sigma_);
  }
  local_f0 = (undefined1  [8])
             (local_100->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage
             .m_rows;
  local_e8.m_value =
       (local_100->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
       m_cols;
  local_e0.m_other = 0.0;
  if ((long)(local_e8.m_value | (ulong)local_f0) < 0) {
    pcVar11 = 
    "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, -1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Matrix<double, -1, -1>]"
    ;
    goto LAB_00106fdf;
  }
  Eigen::internal::call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,0,_1,_1>>
            (local_100,
             (CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
              *)local_f0,(assign_op<double,_double> *)&local_118);
  if (0 < this->n_sigma_) {
    pMVar13 = (RhsNested)0x0;
    do {
      pdVar3 = (Zsig->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
               m_data;
      puVar5 = (undefined1 *)
               (Zsig->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
               m_rows;
      if ((long)puVar5 < 0 && pdVar3 != (double *)0x0) {
LAB_00106f5e:
        __assert_fail("(dataPtr == 0) || ( rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols))"
                      ,"/usr/include/eigen3/Eigen/src/Core/MapBase.h",0xb2,
                      "Eigen::MapBase<Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>, 0>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>, Level = 0]"
                     );
      }
      if ((Zsig->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_cols
          <= (long)pMVar13) {
LAB_00106f3f:
        __assert_fail("(i>=0) && ( ((BlockRows==1) && (BlockCols==XprType::ColsAtCompileTime) && i<xpr.rows()) ||((BlockRows==XprType::RowsAtCompileTime) && (BlockCols==1) && i<xpr.cols()))"
                      ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x7a,
                      "Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>::Block(XprType &, Index) [XprType = Eigen::Matrix<double, -1, -1>, BlockRows = -1, BlockCols = 1, InnerPanel = true]"
                     );
      }
      local_f0 = (undefined1  [8])(pdVar3 + (long)puVar5 * (long)pMVar13);
      local_d0.m_other = 0.0;
      local_e8.m_value = (long)puVar5;
      local_d8 = Zsig;
      local_c8 = pMVar13;
      local_c0 = puVar5;
      local_b8.m_matrix = z_pred;
      if (puVar5 != (undefined1 *)
                    (z_pred->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                    m_storage.m_rows) {
        pcVar11 = 
        "Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>, const Eigen::Matrix<double, -1, 1>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_difference_op<double>, Lhs = const Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>, Rhs = const Eigen::Matrix<double, -1, 1>]"
        ;
        goto LAB_00106fc0;
      }
      Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
      PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true>const,Eigen::Matrix<double,_1,1,0,_1,1>const>>
                ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&local_118,
                 (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                  *)local_f0);
      if (local_118.m_rows < 2) {
LAB_00106f01:
        __assert_fail("index >= 0 && index < size()",
                      "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x1ab,
                      "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
                     );
      }
      local_98 = (double)((ulong)local_118.m_data[1] & 0x8000000000000000 | 0x400921fb54442d18);
      uStack_90 = 0x400921fb54442d18;
      dVar17 = fmod(local_118.m_data[1] + local_98,6.283185307179586);
      if (local_118.m_rows < 2) goto LAB_00106f01;
      local_118.m_data[1] = dVar17 - local_98;
      if ((this->weights_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
          m_rows <= (long)pMVar13) goto LAB_00106f01;
      local_d0.m_other =
           (this->weights_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
           .m_data[(long)pMVar13];
      local_f0 = (undefined1  [8])local_100;
      local_e0.m_other = (double)local_118.m_rows;
      if (((local_100->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
           m_rows != local_118.m_rows) ||
         ((local_100->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
          m_cols != local_118.m_rows)) {
        pcVar11 = 
        "Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::Matrix<double, -1, -1>, const Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1>>, const Eigen::Matrix<double, -1, 1>>, Eigen::Transpose<Eigen::Matrix<double, -1, 1>>>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_sum_op<double>, Lhs = const Eigen::Matrix<double, -1, -1>, Rhs = const Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1>>, const Eigen::Matrix<double, -1, 1>>, Eigen::Transpose<Eigen::Matrix<double, -1, 1>>>]"
        ;
        local_c8 = (RhsNested)&local_118;
        local_b8.m_matrix = (non_const_type)&local_118;
        goto LAB_00106fc0;
      }
      local_c8 = (RhsNested)&local_118;
      local_b8.m_matrix = (non_const_type)&local_118;
      Eigen::internal::
      call_assignment<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const,Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::Matrix<double,_1,1,0,_1,1>const>,Eigen::Transpose<Eigen::Matrix<double,_1,1,0,_1,1>>,0>const>,Eigen::internal::assign_op<double,double>>
                (local_100,
                 (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_0>_>
                  *)local_f0,(assign_op<double,_double> *)&local_a0,(type)0x0);
      free(local_118.m_data);
      pMVar13 = (RhsNested)
                ((long)&(pMVar13->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                        m_storage.m_data + 1);
    } while ((long)pMVar13 < (long)this->n_sigma_);
  }
  local_118.m_data = (double *)0x0;
  local_118.m_rows = 0;
  local_118.m_cols = 0;
  lVar14 = (long)(int)local_80;
  if (lVar14 < 0) {
    __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (rows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (cols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (rows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (cols<=MaxColsAtCompileTime)) && rows>=0 && cols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                  ,"/usr/include/eigen3/Eigen/src/Core/PlainObjectBase.h",0x115,
                  "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, -1>>::resize(Index, Index) [Derived = Eigen::Matrix<double, -1, -1>]"
                 );
  }
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize(&local_118,lVar14 * lVar14,lVar14,lVar14);
  local_e8.m_value = 0;
  local_e0.m_other = 4.94065645841247e-324;
  local_d8 = (MatrixXd *)0x1;
  if ((local_118.m_rows < 1) || (local_118.m_cols < 1)) {
    local_f0 = (undefined1  [8])&local_118;
    __assert_fail("m_xpr.rows() > 0 && m_xpr.cols() > 0 && \"Cannot comma-initialize a 0x0 matrix (operator<<)\""
                  ,"/usr/include/eigen3/Eigen/src/Core/CommaInitializer.h",0x25,
                  "Eigen::CommaInitializer<Eigen::Matrix<double, -1, -1>>::CommaInitializer(XprType &, const Scalar &) [MatrixType = Eigen::Matrix<double, -1, -1>]"
                 );
  }
  *local_118.m_data = this->std_radr_ * this->std_radr_;
  local_a0 = 0.0;
  local_f0 = (undefined1  [8])&local_118;
  pCVar10 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                      ((CommaInitializer<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_f0,
                       &local_a0);
  local_38 = 0.0;
  pCVar10 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                      (pCVar10,&local_38);
  local_40 = 0.0;
  pCVar10 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                      (pCVar10,&local_40);
  local_48 = this->std_radphi_ * this->std_radphi_;
  pCVar10 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                      (pCVar10,&local_48);
  local_50 = 0.0;
  pCVar10 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                      (pCVar10,&local_50);
  local_58 = 0.0;
  pCVar10 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                      (pCVar10,&local_58);
  local_60 = 0.0;
  pCVar10 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                      (pCVar10,&local_60);
  local_68 = this->std_radrd_ * this->std_radrd_;
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_(pCVar10,&local_68);
  dVar17 = *(double *)((long)local_f0 + 0x10);
  if ((long)&(local_d8->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
             m_data + local_e8.m_value != *(long *)((long)local_f0 + 8)) {
    if (dVar17 != 0.0) goto LAB_00107000;
    dVar17 = 0.0;
  }
  if (local_e0.m_other == dVar17) {
    local_f0 = (undefined1  [8])local_100;
    if (((local_100->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
         m_rows == local_118.m_rows) &&
       ((local_100->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
        m_cols == local_118.m_cols)) {
      local_e8.m_value = (long)&local_118;
      Eigen::internal::
      call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const,Eigen::Matrix<double,_1,_1,0,_1,_1>const>,Eigen::internal::assign_op<double,double>>
                (local_100,
                 (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                  *)local_f0,(assign_op<double,_double> *)&local_a0);
      free(local_118.m_data);
      return;
    }
    pcVar11 = 
    "Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::Matrix<double, -1, -1>, const Eigen::Matrix<double, -1, -1>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_sum_op<double>, Lhs = const Eigen::Matrix<double, -1, -1>, Rhs = const Eigen::Matrix<double, -1, -1>]"
    ;
    local_e8.m_value = (long)&local_118;
LAB_00106fc0:
    __assert_fail("aLhs.rows() == aRhs.rows() && aLhs.cols() == aRhs.cols()",
                  "/usr/include/eigen3/Eigen/src/Core/CwiseBinaryOp.h",0x74,pcVar11);
  }
LAB_00107000:
  __assert_fail("((m_row+m_currentBlockRows) == m_xpr.rows() || m_xpr.cols() == 0) && m_col == m_xpr.cols() && \"Too few coefficients passed to comma initializer (operator<<)\""
                ,"/usr/include/eigen3/Eigen/src/Core/CommaInitializer.h",0x7c,
                "XprType &Eigen::CommaInitializer<Eigen::Matrix<double, -1, -1>>::finished() [MatrixType = Eigen::Matrix<double, -1, -1>]"
               );
}

Assistant:

void UKF::PredictRadarMeasurement(const MatrixXd &Xsig_pred, MatrixXd &Zsig, VectorXd &z_pred, MatrixXd &S) {

  //set measurement dimension, radar can measure r, phi, and r_dot
  int n_z = z_pred.rows();

  // transform sigma points into measurement space

  for (int i = 0; i < n_sigma_; i++) {

    // extract values for better readability
    double px  = Xsig_pred(0, i);
    double py  = Xsig_pred(1, i);
    double v   = Xsig_pred(2, i);
    double yaw = Xsig_pred(3, i);

    double v1 = cos(yaw) * v;
    double v2 = sin(yaw) * v;

    // measurement model
    Zsig(0, i) = sqrt(px*px + py*py);                  // r
    Zsig(1, i) = atan2(py, px);                        //phi
    if (Zsig(0, i) != 0) {
      Zsig(2, i) = (px * v1 + py * v2) / Zsig(0, i);   //r_dot
    } else {
      Zsig(2, i) = 0;
    }
  }

  // mean predicted measurement
  z_pred.fill(0.0);
  for (int i=0; i < n_sigma_; i++) {
    z_pred = z_pred + weights_(i) * Zsig.col(i);
  }

  // measurement covariance matrix S
  S.fill(0.0);
  for (int i=0; i < n_sigma_; i++) {
    // residual
    VectorXd z_diff = Zsig.col(i) - z_pred;
    z_diff(1) = normalizeRadiansPiToMinusPi(z_diff(1));

    S = S + weights_(i) * z_diff * z_diff.transpose();
  }

  // add measurement noise covariance matrix to the measurement covariance matrix
  MatrixXd R = MatrixXd(n_z, n_z);
  R <<    std_radr_*std_radr_, 0,                       0,
          0,                   std_radphi_*std_radphi_, 0,
          0,                   0,                       std_radrd_*std_radrd_;

  S = S + R;
}